

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_type_get_contents_
               (MPIABI_Fint *datatype,MPIABI_Fint *max_integers,MPIABI_Fint *max_addresses,
               MPIABI_Fint *max_datatypes,int *array_of_integers,MPIABI_Fint *array_of_addresses,
               MPIABI_Fint *array_of_datatypes,MPIABI_Fint *ierror)

{
  MPIABI_Fint *array_of_addresses_local;
  int *array_of_integers_local;
  MPIABI_Fint *max_datatypes_local;
  MPIABI_Fint *max_addresses_local;
  MPIABI_Fint *max_integers_local;
  MPIABI_Fint *datatype_local;
  
  mpi_type_get_contents_
            (datatype,max_integers,max_addresses,max_datatypes,array_of_integers,array_of_addresses,
             array_of_datatypes,ierror);
  return;
}

Assistant:

void mpiabi_type_get_contents_(
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * max_integers,
  const MPIABI_Fint * max_addresses,
  const MPIABI_Fint * max_datatypes,
  int * array_of_integers,
  MPIABI_Fint * array_of_addresses,
  MPIABI_Fint * array_of_datatypes,
  MPIABI_Fint * ierror
) {
  return mpi_type_get_contents_(
    datatype,
    max_integers,
    max_addresses,
    max_datatypes,
    array_of_integers,
    array_of_addresses,
    array_of_datatypes,
    ierror
  );
}